

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

size_t __thiscall TxRequestTracker::Impl::Count(Impl *this,NodeId peer)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  long in_FS_OFFSET;
  
  uVar1 = (this->m_peerinfo)._M_h._M_bucket_count;
  p_Var3 = (_Hash_node_base *)0x0;
  uVar4 = (ulong)peer % uVar1;
  p_Var2 = (this->m_peerinfo)._M_h._M_buckets[uVar4];
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var5 = p_Var2->_M_nxt;
    if (p_Var5[1]._M_nxt != (_Hash_node_base *)peer) {
      p_Var3 = (_Hash_node_base *)0x0;
      do {
        p_Var5 = p_Var5->_M_nxt;
        if (p_Var5 == (_Hash_node_base *)0x0) goto LAB_00adf6ad;
        if ((ulong)p_Var5[1]._M_nxt % uVar1 != uVar4) goto LAB_00adf6ad;
      } while (p_Var5[1]._M_nxt != (_Hash_node_base *)peer);
    }
    p_Var3 = p_Var5[2]._M_nxt;
  }
LAB_00adf6ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (size_t)p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

size_t Count(NodeId peer) const
    {
        auto it = m_peerinfo.find(peer);
        if (it != m_peerinfo.end()) return it->second.m_total;
        return 0;
    }